

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O1

void __thiscall FIX::DataDictionary::addHeaderField(DataDictionary *this,int field,bool required)

{
  iterator __position;
  mapped_type *pmVar1;
  int local_14;
  
  if (this[0xd] == (DataDictionary)0x1) {
    __position._M_current = *(int **)(this + 0x350);
    if (__position._M_current == *(int **)(this + 0x358)) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)(this + 0x348),__position,&local_14);
    }
    else {
      *__position._M_current = field;
      *(int **)(this + 0x350) = __position._M_current + 1;
    }
  }
  pmVar1 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
           operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                       *)(this + 0x168),&local_14);
  *pmVar1 = required;
  return;
}

Assistant:

void addHeaderField( int field, bool required )
  {
    if (m_storeMsgFieldsOrder)
    {
      m_headerOrderedFields.push_back(field);
    }

    m_headerFields[ field ] = required;
  }